

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

uint8_t * protozero::proto_utils::ParseVarInt(uint8_t *start,uint8_t *end,uint64_t *out_value)

{
  uint local_3c;
  uint8_t cur_byte;
  ulong uStack_38;
  uint32_t shift;
  uint64_t value;
  uint8_t *pos;
  uint64_t *out_value_local;
  uint8_t *end_local;
  uint8_t *start_local;
  
  uStack_38 = 0;
  local_3c = 0;
  value = (uint64_t)start;
  while( true ) {
    if (end <= value || 0x3f < local_3c) {
      *out_value = 0;
      return start;
    }
    uStack_38 = (long)(int)(*(byte *)value & 0x7f) << ((byte)local_3c & 0x3f) | uStack_38;
    if ((*(byte *)value & 0x80) == 0) break;
    local_3c = local_3c + 7;
    value = value + 1;
  }
  *out_value = uStack_38;
  return (uint8_t *)(value + 1);
}

Assistant:

inline const uint8_t* ParseVarInt(const uint8_t* start,
                                  const uint8_t* end,
                                  uint64_t* out_value) {
  const uint8_t* pos = start;
  uint64_t value = 0;
  for (uint32_t shift = 0; pos < end && shift < 64u; shift += 7) {
    // Cache *pos into |cur_byte| to prevent that the compiler dereferences the
    // pointer twice (here and in the if() below) due to char* aliasing rules.
    uint8_t cur_byte = *pos++;
    value |= static_cast<uint64_t>(cur_byte & 0x7f) << shift;
    if ((cur_byte & 0x80) == 0) {
      // In valid cases we get here.
      *out_value = value;
      return pos;
    }
  }
  *out_value = 0;
  return start;
}